

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O0

void __thiscall
LlvmCompilationContext::LlvmCompilationContext(LlvmCompilationContext *this,ExpressionContext *ctx)

{
  ExpressionContext *ctx_local;
  LlvmCompilationContext *this_local;
  
  this->ctx = ctx;
  SmallArray<LLVMTypeRefOpaque_*,_128U>::SmallArray(&this->types,ctx->allocator);
  SmallArray<LLVMValueRefOpaque_*,_128U>::SmallArray(&this->functions,ctx->allocator);
  SmallDenseMap<unsigned_int,_LLVMValueRefOpaque_*,_SmallDenseMapUnsignedHasher,_128U>::
  SmallDenseMap(&this->variables,(Allocator *)0x0);
  SmallArray<LLVMBasicBlockRefOpaque_*,_16U>::SmallArray(&this->currentRestoreBlocks,ctx->allocator)
  ;
  SmallArray<LlvmCompilationContext::LoopInfo,_32U>::SmallArray(&this->loopInfo,ctx->allocator);
  this->allocator = ctx->allocator;
  this->enableOptimization = false;
  this->context = (LLVMContextRef)0x0;
  this->module = (LLVMModuleRef)0x0;
  this->builder = (LLVMBuilderRef)0x0;
  this->functionPassManager = (LLVMPassManagerRef)0x0;
  this->skipFunctionDefinitions = false;
  this->currentFunction = (LLVMValueRef)0x0;
  this->currentFunctionSource = (FunctionData *)0x0;
  this->currentFunctionGlobal = false;
  this->currentNextRestoreBlock = 0;
  return;
}

Assistant:

LlvmCompilationContext(ExpressionContext &ctx): ctx(ctx), types(ctx.allocator), functions(ctx.allocator), currentRestoreBlocks(ctx.allocator), loopInfo(ctx.allocator), allocator(ctx.allocator)
	{
		enableOptimization = false;

		context = NULL;

		module = NULL;

		builder = NULL;

		functionPassManager = NULL;

		skipFunctionDefinitions = false;

		currentFunction = NULL;
		currentFunctionSource = NULL;
		currentFunctionGlobal = false;

		currentNextRestoreBlock = 0;
	}